

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O3

void test_fragmented_message(void)

{
  int iVar1;
  ptls_t tls;
  st_ptls_record_t local_260;
  ptls_t local_248;
  
  memset(&local_248,0,0x218);
  local_260.type = '\x16';
  local_260._1_1_ = 0;
  local_260.version = 0x301;
  local_260._4_4_ = 0;
  test_fragmented_message_queue.count = 0;
  local_260.length = 7;
  local_260.fragment = "\x01";
  iVar1 = handle_handshake_record
                    (&local_248,test_fragmented_message_record,(ptls_message_emitter_t *)0x0,
                     &local_260,(ptls_handshake_properties_t *)0x0);
  _ok((uint)(iVar1 == 0),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x1cf);
  _ok((uint)(test_fragmented_message_queue.count == 1),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x1d0);
  _ok((uint)(test_fragmented_message_queue.vec[0].len == 7),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x1d1);
  _ok((uint)(CONCAT31(test_fragmented_message_queue.vec[0].buf._4_3_,
                      test_fragmented_message_queue.vec[0].buf[3]) == 0x63626103 &&
            test_fragmented_message_queue.vec[0].buf._0_4_ == 0x3000001),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x1d2);
  _ok(test_fragmented_message_queue.vec[0].is_end_of_record,"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x1d3);
  _ok((uint)(local_248.recvbuf.mess.base == (uint8_t *)0x0),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x1d4);
  test_fragmented_message_queue.count = 0;
  local_260.length = 5;
  local_260.fragment = "\x01";
  iVar1 = handle_handshake_record
                    (&local_248,test_fragmented_message_record,(ptls_message_emitter_t *)0x0,
                     &local_260,(ptls_handshake_properties_t *)0x0);
  _ok((uint)(iVar1 == 0x202),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x1db);
  _ok((uint)(local_248.recvbuf.mess.base != (uint8_t *)0x0),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x1dc);
  _ok((uint)(test_fragmented_message_queue.count == 0),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x1dd);
  local_260.length = 9;
  local_260.fragment = "bc\x02";
  iVar1 = handle_handshake_record
                    (&local_248,test_fragmented_message_record,(ptls_message_emitter_t *)0x0,
                     &local_260,(ptls_handshake_properties_t *)0x0);
  _ok((uint)(iVar1 == 0x202),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x1e2);
  _ok((uint)(test_fragmented_message_queue.count == 2),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x1e3);
  _ok((uint)(test_fragmented_message_queue.vec[0].len == 7),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x1e4);
  _ok((uint)(CONCAT31(test_fragmented_message_queue.vec[0].buf._4_3_,
                      test_fragmented_message_queue.vec[0].buf[3]) == 0x63626103 &&
            test_fragmented_message_queue.vec[0].buf._0_4_ == 0x3000001),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x1e8);
  _ok((uint)(test_fragmented_message_queue.vec[0].is_end_of_record == 0),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x1e9);
  _ok((uint)(test_fragmented_message_queue.vec[1].len == 6),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x1ea);
  _ok((uint)(test_fragmented_message_queue.vec[1].buf._4_2_ == 0x6564 &&
            test_fragmented_message_queue.vec[1].buf._0_4_ == 0x2000002),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x1ee);
  _ok((uint)(test_fragmented_message_queue.vec[1].is_end_of_record == 0),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x1ef);
  local_260.length = 6;
  local_260.fragment = "";
  iVar1 = handle_handshake_record
                    (&local_248,test_fragmented_message_record,(ptls_message_emitter_t *)0x0,
                     &local_260,(ptls_handshake_properties_t *)0x0);
  _ok((uint)(iVar1 == 0),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",499);
  _ok((uint)(local_248.recvbuf.mess.base == (uint8_t *)0x0),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",500);
  _ok((uint)(test_fragmented_message_queue.count == 3),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x1f5);
  _ok((uint)(test_fragmented_message_queue.vec[2].len == 7),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x1f6);
  _ok((uint)(CONCAT31(test_fragmented_message_queue.vec[2].buf._4_3_,
                      test_fragmented_message_queue.vec[2].buf[3]) == 0x646e6503 &&
            test_fragmented_message_queue.vec[2].buf._0_4_ == 0x3000003),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x1fa);
  _ok(test_fragmented_message_queue.vec[2].is_end_of_record,"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x1fb);
  return;
}

Assistant:

static void test_fragmented_message(void)
{
    ptls_t tls = {NULL};
    struct st_ptls_record_t rec = {PTLS_CONTENT_TYPE_HANDSHAKE, 0x0301};
    int ret;

#define SET_RECORD(lit)                                                                                                            \
    do {                                                                                                                           \
        rec.length = sizeof(lit) - 1;                                                                                              \
        rec.fragment = (const uint8_t *)(lit);                                                                                     \
    } while (0)

    /* not fragmented */
    test_fragmented_message_queue.count = 0;
    SET_RECORD("\x01\x00\x00\x03"
               "abc");
    ret = handle_handshake_record(&tls, test_fragmented_message_record, NULL, &rec, NULL);
    ok(ret == 0);
    ok(test_fragmented_message_queue.count == 1);
    ok(test_fragmented_message_queue.vec[0].len == rec.length);
    ok(memcmp(test_fragmented_message_queue.vec[0].buf, rec.fragment, rec.length) == 0);
    ok(test_fragmented_message_queue.vec[0].is_end_of_record);
    ok(tls.recvbuf.mess.base == NULL);

    /* fragmented */
    test_fragmented_message_queue.count = 0;
    SET_RECORD("\x01\x00\x00\x03"
               "a");
    ret = handle_handshake_record(&tls, test_fragmented_message_record, NULL, &rec, NULL);
    ok(ret == PTLS_ERROR_IN_PROGRESS);
    ok(tls.recvbuf.mess.base != NULL);
    ok(test_fragmented_message_queue.count == 0);
    SET_RECORD("bc\x02\x00\x00\x02"
               "de"
               "\x03");
    ret = handle_handshake_record(&tls, test_fragmented_message_record, NULL, &rec, NULL);
    ok(ret == PTLS_ERROR_IN_PROGRESS);
    ok(test_fragmented_message_queue.count == 2);
    ok(test_fragmented_message_queue.vec[0].len == 7);
    ok(memcmp(test_fragmented_message_queue.vec[0].buf,
              "\x01\x00\x00\x03"
              "abc",
              7) == 0);
    ok(!test_fragmented_message_queue.vec[0].is_end_of_record);
    ok(test_fragmented_message_queue.vec[1].len == 6);
    ok(memcmp(test_fragmented_message_queue.vec[1].buf,
              "\x02\x00\x00\x02"
              "de",
              6) == 0);
    ok(!test_fragmented_message_queue.vec[1].is_end_of_record);
    SET_RECORD("\x00\x00\x03"
               "end");
    ret = handle_handshake_record(&tls, test_fragmented_message_record, NULL, &rec, NULL);
    ok(ret == 0);
    ok(tls.recvbuf.mess.base == NULL);
    ok(test_fragmented_message_queue.count == 3);
    ok(test_fragmented_message_queue.vec[2].len == 7);
    ok(memcmp(test_fragmented_message_queue.vec[2].buf,
              "\x03\x00\x00\x03"
              "end",
              7) == 0);
    ok(test_fragmented_message_queue.vec[2].is_end_of_record);

#undef SET_RECORD
}